

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_tiled_irreg_proc_grid(Integer g_a,Integer *mapc,Integer *nblocks,Integer *proc_grid)

{
  global_array_t *pgVar1;
  C_Integer *pCVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long local_48;
  
  lVar4 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set irregular tiled data distribution on array that has been allocated",0);
  }
  if (GA[lVar4].ndim < 1) {
    pnga_error("Cannot set irregular tiled data distribution if array size not set",0);
  }
  if (GA[lVar4].ndim < 1) {
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  }
  if (0 < GA[lVar4].ndim) {
    lVar5 = 0;
    do {
      if (GA[g_a + 1000].dims[lVar5] < nblocks[lVar5]) {
        pnga_error("number of blocks must be <= corresponding dimension",lVar5);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < GA[lVar4].ndim);
  }
  if (GA[lVar4].distr_type != 0) {
    pnga_error("Cannot reset irregular tiled data distribution on array that has been set",0);
  }
  pgVar1 = GA;
  GA[lVar4].distr_type = 4;
  if (0 < pgVar1[lVar4].ndim) {
    lVar5 = 0;
    local_48 = 0;
    do {
      lVar3 = mapc[local_48];
      if ((lVar3 < 1) || (pgVar1[lVar4].dims[lVar5] + 1 < lVar3)) {
        pnga_error("Mapc entry outside array dimension limits",lVar3);
      }
      if (nblocks[lVar5] < 2) {
        local_48 = local_48 + 1;
      }
      else {
        lVar6 = 1;
        do {
          if (mapc[local_48 + lVar6] < lVar3) {
            pnga_error("Mapc entries are not properly monotonic",lVar3);
          }
          lVar3 = mapc[local_48 + lVar6];
          if ((lVar3 < 1) || (GA[lVar4].dims[lVar5] + 1 < lVar3)) {
            pnga_error("Mapc entry outside array dimension limits",lVar3);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < nblocks[lVar5]);
        local_48 = local_48 + lVar6;
      }
      lVar5 = lVar5 + 1;
      pgVar1 = GA;
    } while (lVar5 < GA[lVar4].ndim);
  }
  pgVar1 = GA;
  if (GA[lVar4].ndim < 1) {
    lVar5 = 0;
  }
  else {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = nblocks[lVar3];
      pgVar1[g_a + 1000].num_blocks[lVar3] = lVar6;
      if (proc_grid[lVar3] < 1) {
        pnga_error("Processor grid dimensions must all be greater than zero",0);
      }
      pgVar1 = GA;
      lVar5 = lVar5 + lVar6;
      GA[g_a + 1000].nblock[lVar3] = (int)proc_grid[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 < pgVar1[lVar4].ndim);
  }
  pCVar2 = (C_Integer *)malloc(lVar5 * 8 + 8);
  pgVar1[lVar4].mapc = pCVar2;
  if (0 < lVar5) {
    pCVar2 = GA[lVar4].mapc;
    lVar3 = 0;
    do {
      pCVar2[lVar3] = mapc[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar5 != lVar3);
  }
  pgVar1 = GA;
  GA[lVar4].mapc[lVar5] = -1;
  pgVar1[lVar4].irreg = 1;
  lVar5 = 1;
  if (0 < (long)pgVar1[lVar4].ndim) {
    lVar3 = 0;
    do {
      lVar5 = lVar5 * pgVar1[lVar4].num_blocks[lVar3];
      lVar3 = lVar3 + 1;
    } while (pgVar1[lVar4].ndim != lVar3);
  }
  pgVar1[lVar4].block_total = lVar5;
  return;
}

Assistant:

void pnga_set_tiled_irreg_proc_grid(Integer g_a, Integer *mapc, Integer *nblocks,
    Integer *proc_grid)
{
  Integer i, j, ichk, maplen, jsize;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular tiled data distribution on array"
        " that has been allocated",0);
  if (!(GA[ga_handle].ndim > 0))
    pnga_error("Cannot set irregular tiled data distribution if array size not set",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblocks[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  if (GA[ga_handle].distr_type != REGULAR)
    pnga_error("Cannot reset irregular tiled data distribution on array that has been set",0);
  GA[ga_handle].distr_type = TILED_IRREG;
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblocks[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblocks[i];
    GA[ga_handle].num_blocks[i] = (C_Integer)nblocks[i];
    if (proc_grid[i] < 1)
      pnga_error("Processor grid dimensions must all be greater than zero",0);
    GA[ga_handle].nblock[i] = proc_grid[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;

  /* Find total number of blocks */
  jsize = 1;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    jsize *= GA[ga_handle].num_blocks[i];
  }
  GA[ga_handle].block_total = jsize;
}